

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

void __thiscall
dg::LLVMPointerAnalysis::LLVMPointerAnalysis
          (LLVMPointerAnalysis *this,LLVMPointerAnalysisOptions *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_t sVar5;
  bool bVar6;
  undefined6 uVar7;
  
  this->_vptr_LLVMPointerAnalysis = (_func_int **)&PTR___cxa_pure_virtual_0011a860;
  paVar1 = &(this->options).super_LLVMAnalysisOptions.entryFunction.field_2;
  (this->options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p;
  paVar2 = &(opts->super_LLVMAnalysisOptions).entryFunction.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(opts->super_LLVMAnalysisOptions).entryFunction.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->options).super_LLVMAnalysisOptions.entryFunction.field_2 + 8) =
         uVar4;
  }
  else {
    (this->options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = pcVar3;
    (this->options).super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->options).super_LLVMAnalysisOptions.entryFunction._M_string_length =
       (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length;
  (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p = (pointer)paVar2;
  (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length = 0;
  (opts->super_LLVMAnalysisOptions).entryFunction.field_2._M_local_buf[0] = '\0';
  (this->options).super_PointerAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset =
       (opts->super_PointerAnalysisOptions).super_AnalysisOptions.fieldSensitivity.offset;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->options).super_PointerAnalysisOptions.super_AnalysisOptions.allocationFunctions
              ._M_t._M_impl.super__Rb_tree_header,
             &(opts->super_PointerAnalysisOptions).super_AnalysisOptions.allocationFunctions._M_t.
              _M_impl.super__Rb_tree_header);
  bVar6 = (opts->super_PointerAnalysisOptions).invalidateNodes;
  uVar7 = *(undefined6 *)&(opts->super_PointerAnalysisOptions).field_0x3a;
  sVar5 = (opts->super_PointerAnalysisOptions).maxIterations;
  (this->options).super_PointerAnalysisOptions.preprocessGeps =
       (opts->super_PointerAnalysisOptions).preprocessGeps;
  (this->options).super_PointerAnalysisOptions.invalidateNodes = bVar6;
  *(undefined6 *)&(this->options).super_PointerAnalysisOptions.field_0x3a = uVar7;
  (this->options).super_PointerAnalysisOptions.maxIterations = sVar5;
  (this->options).analysisType = opts->analysisType;
  (this->options).threads = opts->threads;
  return;
}

Assistant:

LLVMPointerAnalysis(LLVMPointerAnalysisOptions opts)
            : options(std::move(opts)){}